

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaBucketFree(xmlSchemaBucketPtr_conflict bucket)

{
  xmlSchemaSchemaRelationPtr pxVar1;
  xmlSchemaSchemaRelationPtr_conflict pxVar2;
  
  if (bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    if (bucket->globals != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaComponentListFree(bucket->globals);
      xmlSchemaItemListFree(bucket->globals);
    }
    if (bucket->locals != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaComponentListFree(bucket->locals);
      xmlSchemaItemListFree(bucket->locals);
    }
    pxVar2 = bucket->relations;
    while (pxVar2 != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      pxVar1 = pxVar2->next;
      (*xmlFree)(pxVar2);
      pxVar2 = pxVar1;
    }
    if ((bucket->preserveDoc == 0) && (bucket->doc != (xmlDocPtr)0x0)) {
      xmlFreeDoc(bucket->doc);
    }
    if ((bucket->type == 1) && (*(xmlSchemaPtr *)(bucket + 1) != (xmlSchemaPtr)0x0)) {
      xmlSchemaFree(*(xmlSchemaPtr *)(bucket + 1));
    }
    (*xmlFree)(bucket);
    return;
  }
  return;
}

Assistant:

static void
xmlSchemaBucketFree(xmlSchemaBucketPtr bucket)
{
    if (bucket == NULL)
	return;
    if (bucket->globals != NULL) {
	xmlSchemaComponentListFree(bucket->globals);
	xmlSchemaItemListFree(bucket->globals);
    }
    if (bucket->locals != NULL) {
	xmlSchemaComponentListFree(bucket->locals);
	xmlSchemaItemListFree(bucket->locals);
    }
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr prev, cur = bucket->relations;
	do {
	    prev = cur;
	    cur = cur->next;
	    xmlFree(prev);
	} while (cur != NULL);
    }
    if ((! bucket->preserveDoc) && (bucket->doc != NULL)) {
	xmlFreeDoc(bucket->doc);
    }
    if (bucket->type == XML_SCHEMA_SCHEMA_IMPORT) {
	if (WXS_IMPBUCKET(bucket)->schema != NULL)
	    xmlSchemaFree(WXS_IMPBUCKET(bucket)->schema);
    }
    xmlFree(bucket);
}